

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

string * __thiscall
vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *__rhs;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  undefined1 local_19;
  int i;
  OuterEdgeDescription *this_local;
  string *result;
  
  local_19 = 0;
  _i = this;
  this_local = (OuterEdgeDescription *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; local_20 < *(int *)((long)this + 0xc); local_20 = local_20 + 1) {
    std::__cxx11::string::string((string *)&local_c0);
    __rhs = "";
    if (0 < local_20) {
      __rhs = " or ";
    }
    std::operator+(&local_a0,&local_c0,__rhs);
    std::operator+(&local_80,&local_a0,
                   tessellation::anon_unknown_0::OuterEdgeDescription::description::coordinateNames
                   [*this]);
    std::operator+(&local_60,&local_80,"=");
    de::toString<float>(&local_f0,(float *)((long)this + (long)local_20 * 4 + 4));
    std::operator+(&local_40,&local_60,&local_f0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string description (void) const
	{
		static const char* const	coordinateNames[] = { "u", "v", "w" };
		std::string					result;
		for (int i = 0; i < numConstantCoordinateValueChoices; ++i)
			result += std::string() + (i > 0 ? " or " : "") + coordinateNames[constantCoordinateIndex] + "=" + de::toString(constantCoordinateValueChoices[i]);
		return result;
	}